

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O0

int Scl_CommandDumpGen(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  float fVar4;
  double dVar5;
  int fVerbose;
  int c;
  int nGatesMin;
  float Gain;
  float Slew;
  char *pFileName;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  _Gain = (char *)0x0;
  nGatesMin = 0;
  c = 0x43480000;
  fVerbose = 4;
  bVar1 = false;
  Extra_UtilGetoptReset();
LAB_004b70f5:
  iVar2 = Extra_UtilGetopt(argc,argv,"SGMvh");
  if (iVar2 == -1) {
    if (pAbc->pLibScl != (void *)0x0) {
      if (argc == globalUtilOptind + 1) {
        _Gain = argv[globalUtilOptind];
      }
      Abc_SclDumpGenlib(_Gain,(SC_Lib *)pAbc->pLibScl,(float)nGatesMin,(float)c,fVerbose);
      return 0;
    }
    fprintf((FILE *)pAbc->Err,"There is no Liberty library available.\n");
    goto LAB_004b7320;
  }
  switch(iVar2) {
  case 0x47:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-G\" should be followed by a floating point number.\n");
      goto LAB_004b7320;
    }
    dVar5 = atof(argv[globalUtilOptind]);
    c = (int)(float)dVar5;
    fVar4 = (float)c;
    break;
  default:
    goto LAB_004b7320;
  case 0x4d:
    if (globalUtilOptind < argc) goto LAB_004b724e;
    Abc_Print(-1,"Command line switch \"-M\" should be followed by a positive integer.\n");
    goto LAB_004b7320;
  case 0x53:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-S\" should be followed by a floating point number.\n");
      goto LAB_004b7320;
    }
    dVar5 = atof(argv[globalUtilOptind]);
    nGatesMin = (int)(float)dVar5;
    fVar4 = (float)nGatesMin;
    break;
  case 0x68:
    goto LAB_004b7320;
  case 0x76:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_004b70f5;
  }
  globalUtilOptind = globalUtilOptind + 1;
  if (fVar4 <= 0.0) goto LAB_004b7320;
  goto LAB_004b70f5;
LAB_004b724e:
  fVerbose = atoi(argv[globalUtilOptind]);
  globalUtilOptind = globalUtilOptind + 1;
  if (fVerbose < 0) {
LAB_004b7320:
    fprintf((FILE *)pAbc->Err,"usage: dump_genlib [-SG float] [-M num] [-vh] <file>\n");
    fprintf((FILE *)pAbc->Err,"\t           writes GENLIB file for SCL library\n");
    fprintf((FILE *)pAbc->Err,
            "\t-S float : the slew parameter used to generate the library [default = %.2f]\n",
            (double)(float)nGatesMin);
    fprintf((FILE *)pAbc->Err,
            "\t-G float : the gain parameter used to generate the library [default = %.2f]\n",
            (double)(float)c);
    fprintf((FILE *)pAbc->Err,
            "\t-M num   : skip gate classes whose size is less than this [default = %d]\n",
            (ulong)(uint)fVerbose);
    pcVar3 = "no";
    if (bVar1) {
      pcVar3 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-v       : toggle printing verbose information [default = %s]\n",
            pcVar3);
    fprintf((FILE *)pAbc->Err,"\t-h       : print the command usage\n");
    fprintf((FILE *)pAbc->Err,"\t<file>   : optional GENLIB file name\n");
    return 1;
  }
  goto LAB_004b70f5;
}

Assistant:

int Scl_CommandDumpGen( Abc_Frame_t * pAbc, int argc, char **argv )
{
    char * pFileName = NULL;
    float Slew = 0; // use the library
    float Gain = 200;
    int nGatesMin = 4;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "SGMvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a floating point number.\n" );
                goto usage;
            }
            Slew = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Slew <= 0.0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by a floating point number.\n" );
                goto usage;
            }
            Gain = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Gain <= 0.0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nGatesMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nGatesMin < 0 ) 
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pLibScl == NULL )
    {
        fprintf( pAbc->Err, "There is no Liberty library available.\n" );
        goto usage;
    }
    if ( argc == globalUtilOptind + 1 )
        pFileName = argv[globalUtilOptind];
    Abc_SclDumpGenlib( pFileName, (SC_Lib *)pAbc->pLibScl, Slew, Gain, nGatesMin );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: dump_genlib [-SG float] [-M num] [-vh] <file>\n" );
    fprintf( pAbc->Err, "\t           writes GENLIB file for SCL library\n" );
    fprintf( pAbc->Err, "\t-S float : the slew parameter used to generate the library [default = %.2f]\n", Slew );
    fprintf( pAbc->Err, "\t-G float : the gain parameter used to generate the library [default = %.2f]\n", Gain );
    fprintf( pAbc->Err, "\t-M num   : skip gate classes whose size is less than this [default = %d]\n", nGatesMin );
    fprintf( pAbc->Err, "\t-v       : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-h       : print the command usage\n");
    fprintf( pAbc->Err, "\t<file>   : optional GENLIB file name\n");
    return 1;
}